

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

longdouble * get_ldouble(longdouble *__return_storage_ptr__,MIR_context_t ctx)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint64_t res;
  anon_union_16_2_0ec0f880 u;
  
  lVar3 = 0;
  do {
    get_byte((MIR_context_t)__return_storage_ptr__);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x40);
  uVar4 = 0;
  do {
    iVar2 = get_byte((MIR_context_t)__return_storage_ptr__);
    uVar1 = uVar4 & 0x3f;
    uVar4 = uVar4 + 8;
  } while (uVar4 != 0x40);
  return (longdouble *)((long)iVar2 << uVar1);
}

Assistant:

static long double get_ldouble (MIR_context_t ctx) {
  union {
    uint64_t u[2];
    long double ld;
  } u;

  u.u[0] = get_uint (ctx, sizeof (uint64_t));
  u.u[1] = get_uint (ctx, sizeof (uint64_t));
  return u.ld;
}